

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,8u>>(int bias)

{
  int delta;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint recent;
  uint uVar6;
  uint absDiff;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  bVar9 = false;
  uVar4 = 0;
  do {
    uVar5 = uVar4 & 0xff;
    uVar6 = 0;
    do {
      iVar1 = uVar4 - uVar6;
      if (uVar4 < uVar6 || iVar1 == 0) {
        if ((int)(uVar6 - uVar4) <= (int)(bias + 0x80U)) goto LAB_001028d4;
        iVar3 = 7;
      }
      else {
        iVar3 = 7;
        if (iVar1 < (int)(0x80U - bias)) {
LAB_001028d4:
          uVar7 = uVar6 & 0x100 | uVar5;
          uVar2 = uVar6 & 0xff;
          if (uVar2 < uVar5) {
            uVar8 = uVar7 - 0x100;
            if (uVar5 - uVar2 < 0x80U - bias) {
              uVar8 = uVar7;
            }
          }
          else {
            uVar8 = uVar7 + 0x100;
            if (uVar2 - uVar5 <= bias + 0x80U) {
              uVar8 = uVar7;
            }
          }
          iVar3 = 1;
          if ((uVar8 == uVar4) && ((bias != 0 || ((int)(char)iVar1 + uVar6 == uVar4)))) {
            iVar3 = 0;
          }
        }
      }
      if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_0010294a;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x200);
    iVar3 = 5;
LAB_0010294a:
    if ((iVar3 != 5) && (iVar3 != 0)) {
      return bVar9;
    }
    bVar9 = 0x1fe < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x200) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}